

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

tuple<unsigned_long,_unsigned_long> __thiscall
qclab::qgates::masks(qgates *this,int nbQubits,int qubit)

{
  byte bVar1;
  undefined4 in_register_00000014;
  tuple<unsigned_long,_unsigned_long> tVar2;
  
  tVar2.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ = in_register_00000014;
  tVar2.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._0_4_ = qubit;
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/apply.hpp"
                  ,0xe5,"std::tuple<uint64_t, uint64_t> qclab::qgates::masks(const int, const int)")
    ;
  }
  if (qubit < nbQubits) {
    bVar1 = ~(byte)qubit + (char)nbQubits;
    *(long *)this = ~(-1L << (bVar1 & 0x3f));
    *(long *)(this + 8) = ~(-1L << ((byte)qubit & 0x3f)) << (bVar1 & 0x3f);
    tVar2.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>
    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
    return (tuple<unsigned_long,_unsigned_long>)
           tVar2.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
  }
  __assert_fail("qubit < nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xe6,"std::tuple<uint64_t, uint64_t> qclab::qgates::masks(const int, const int)");
}

Assistant:

inline
  std::tuple< uint64_t , uint64_t > masks( const int nbQubits ,
                                           const int qubit ) {
    assert( nbQubits >= 1 ) ;
    assert( qubit < nbQubits ) ;
    // mask lengths
    const int nL = qubit ;
    const int nR = nbQubits - qubit - 1 ;
    // masks
    const uint64_t mL = ( ( 1ULL << nL ) - 1 ) << nR ;
    const uint64_t mR =   ( 1ULL << nR ) - 1 ;
    return { mL , mR } ;
  }